

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerWrite(PgHdr *pPg)

{
  uint uVar1;
  uint uVar2;
  Pager *pPVar3;
  sqlite3_file *psVar4;
  sqlite3_vfs *psVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  DbPage *pPg_00;
  int iVar9;
  long lVar10;
  u32 i;
  int *piVar11;
  uint pgno;
  long lVar12;
  int iVar13;
  Pager *pPStack_40;
  undefined8 uStack_38;
  
  pPVar3 = pPg->pPager;
  if (((pPg->flags & 4) != 0) && (pPg->pgno <= pPVar3->dbSize)) {
    if (pPVar3->nSavepoint == 0) {
      return 0;
    }
    pPStack_40 = pPg->pPager;
    iVar8 = pPStack_40->nSavepoint;
    lVar10 = (long)iVar8;
    if (0 < lVar10) {
      uVar1 = pPg->pgno;
      piVar11 = &pPStack_40->aSavepoint[1].bTruncateOnRelease;
      lVar12 = 1;
      do {
        if ((uVar1 <= (uint)piVar11[-0x10]) &&
           (iVar9 = sqlite3BitvecTestNotNull(*(Bitvec **)(piVar11 + -0x12),uVar1),
           pPVar3 = pPStack_40, iVar9 == 0)) {
          if ((int)lVar12 < iVar8) {
            do {
              *piVar11 = 0;
              lVar10 = lVar10 + -1;
              piVar11 = piVar11 + 0xe;
            } while (lVar12 != lVar10);
          }
          iVar8 = 0;
          if (pPStack_40->journalMode != '\x02') {
            psVar4 = pPStack_40->sjfd;
            iVar8 = 0;
            if (psVar4->pMethods == (sqlite3_io_methods *)0x0) {
              if ((pPStack_40->journalMode == '\x04') ||
                 (iVar9 = sqlite3Config.nStmtSpill, pPStack_40->subjInMemory != '\0')) {
                iVar9 = -1;
              }
              psVar5 = pPStack_40->pVfs;
              psVar4[8].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[9].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[6].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[7].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[4].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[5].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[2].pMethods = (sqlite3_io_methods *)0x0;
              psVar4[3].pMethods = (sqlite3_io_methods *)0x0;
              psVar4->pMethods = (sqlite3_io_methods *)0x0;
              psVar4[1].pMethods = (sqlite3_io_methods *)0x0;
              if (iVar9 == 0) {
                iVar8 = (*psVar5->xOpen)((sqlite3_file *)psVar5,0);
              }
              else {
                iVar13 = 0x3f8;
                if (0 < iVar9) {
                  iVar13 = iVar9;
                }
                *(int *)&psVar4[1].pMethods = iVar13;
                psVar4->pMethods = &MemJournalMethods;
                *(int *)((long)&psVar4[1].pMethods + 4) = iVar9;
                *(undefined4 *)&psVar4[7].pMethods = 0x201e;
                psVar4[9].pMethods = (sqlite3_io_methods *)0x0;
                psVar4[8].pMethods = (sqlite3_io_methods *)psVar5;
              }
            }
            if (iVar8 == 0) {
              pvVar6 = pPg->pData;
              lVar10 = (pPVar3->pageSize + 4) * (ulong)pPVar3->nSubRec;
              uVar1 = pPg->pgno;
              uStack_38 = (PgHdr *)CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                            (uVar1 & 0xff00) << 8 | uVar1 << 0x18,
                                            (undefined4)uStack_38);
              iVar8 = (*pPVar3->sjfd->pMethods->xWrite)
                                (pPVar3->sjfd,(void *)((long)&uStack_38 + 4),4,lVar10);
              if (iVar8 == 0) {
                iVar8 = (*pPVar3->sjfd->pMethods->xWrite)
                                  (pPVar3->sjfd,pvVar6,(int)pPVar3->pageSize,lVar10 + 4);
              }
            }
          }
          if (iVar8 != 0) {
            return iVar8;
          }
          pPVar3->nSubRec = pPVar3->nSubRec + 1;
          iVar8 = addToSavepointBitvecs(pPVar3,pPg->pgno);
          return iVar8;
        }
        piVar11 = piVar11 + 0xe;
        bVar7 = lVar12 != lVar10;
        lVar12 = lVar12 + 1;
      } while (bVar7);
    }
    return 0;
  }
  if (pPVar3->errCode != 0) {
    return pPVar3->errCode;
  }
  if (pPVar3->sectorSize <= (uint)pPVar3->pageSize) {
    iVar8 = pager_write(pPg);
    return iVar8;
  }
  pPVar3 = pPg->pPager;
  uVar1 = pPVar3->dbSize;
  pPVar3->doNotSpill = pPVar3->doNotSpill | 4;
  uVar2 = pPg->pgno;
  iVar8 = SUB164(ZEXT416(pPVar3->sectorSize) / SEXT816(pPVar3->pageSize),0);
  pgno = -iVar8 & uVar2 - 1;
  if (uVar1 < uVar2) {
    iVar9 = uVar2 - pgno;
  }
  else {
    iVar9 = uVar1 - pgno;
    if (pgno + iVar8 <= uVar1) {
      iVar9 = iVar8;
    }
  }
  uStack_38 = pPg;
  if (iVar9 < 1) {
    iVar8 = 0;
    bVar7 = false;
  }
  else {
    bVar7 = false;
    iVar13 = 1;
    do {
      i = pgno + iVar13;
      if (((i == uStack_38->pgno) || (pPVar3->pInJournal == (Bitvec *)0x0)) ||
         (iVar8 = sqlite3BitvecTestNotNull(pPVar3->pInJournal,i), iVar8 == 0)) {
        iVar8 = 0;
        if ((i != pPVar3->lckPgno) &&
           (iVar8 = (*pPVar3->xGet)(pPVar3,i,(DbPage **)&pPStack_40,0), iVar8 == 0)) {
          iVar8 = pager_write((PgHdr *)pPStack_40);
          if ((*(ushort *)&pPStack_40->nRec & 8) != 0) {
            bVar7 = true;
          }
          goto LAB_00150d12;
        }
      }
      else {
        pPStack_40 = (Pager *)sqlite3PagerLookup(pPVar3,i);
        iVar8 = 0;
        if (pPStack_40 != (Pager *)0x0) {
          iVar8 = 0;
          if ((*(ushort *)&pPStack_40->nRec & 8) != 0) {
            bVar7 = true;
          }
LAB_00150d12:
          sqlite3PagerUnrefNotNull((DbPage *)pPStack_40);
        }
      }
    } while ((iVar13 < iVar9) && (iVar13 = iVar13 + 1, iVar8 == 0));
    bVar7 = bVar7 && iVar8 == 0;
  }
  if ((bVar7) && (0 < iVar9)) {
    do {
      pgno = pgno + 1;
      pPg_00 = sqlite3PagerLookup(pPVar3,pgno);
      if (pPg_00 != (DbPage *)0x0) {
        *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
        sqlite3PagerUnrefNotNull(pPg_00);
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfb;
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}